

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O0

uint64_t phf_a_s_mod_n(uint64_t a,uint64_t s,uint64_t n)

{
  uint64_t local_28;
  uint64_t v;
  uint64_t n_local;
  uint64_t s_local;
  uint64_t a_local;
  
  if (n < 0x100000000) {
    local_28 = 1;
    s_local = a % n;
    for (n_local = s; n_local != 0; n_local = n_local >> 1) {
      if ((n_local & 1) == 1) {
        local_28 = (local_28 * s_local) % n;
      }
      s_local = (s_local * s_local) % n;
    }
    return local_28;
  }
  __assert_fail("n <= UINT32_MAX",
                "/workspace/llm4binary/github/license_c_cmakelists/bakwc[P]JamSpell/contrib/phf/phf.cc"
                ,0x66,"uint64_t phf_a_s_mod_n(uint64_t, uint64_t, uint64_t)");
}

Assistant:

static inline uint64_t phf_a_s_mod_n(uint64_t a, uint64_t s, uint64_t n) {
	uint64_t v;

	assert(n <= UINT32_MAX);

	v = 1;
	a %= n;

	while (s > 0) {
		if (s % 2 == 1)
			v = (v * a) % n;
		a = (a * a) % n;
		s /= 2;
	}

	return v;
}